

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_sqr(void)

{
  int iVar1;
  secp256k1_fe tmp;
  secp256k1_fe rhs;
  secp256k1_fe lhs;
  secp256k1_fe y;
  secp256k1_fe x;
  int i;
  secp256k1_fe *in_stack_ffffffffffffff28;
  secp256k1_fe *in_stack_ffffffffffffff30;
  secp256k1_fe *in_stack_ffffffffffffff40;
  secp256k1_fe *in_stack_ffffffffffffff78;
  secp256k1_fe *in_stack_ffffffffffffff80;
  secp256k1_fe local_58;
  secp256k1_fe local_30;
  int local_4;
  
  secp256k1_fe_impl_set_int(&local_30,1);
  secp256k1_fe_impl_negate_unchecked(&local_30,&local_30,1);
  local_4 = 1;
  while( true ) {
    if (0x200 < local_4) {
      return;
    }
    secp256k1_fe_impl_mul_int_unchecked(&local_30,2);
    secp256k1_fe_impl_normalize(&local_30);
    testutil_random_fe_test(in_stack_ffffffffffffff40);
    memcpy(&stack0xffffffffffffff80,&local_30,0x28);
    secp256k1_fe_impl_add((secp256k1_fe *)&stack0xffffffffffffff80,&local_58);
    secp256k1_fe_impl_negate_unchecked((secp256k1_fe *)&stack0xffffffffffffff30,&local_58,1);
    secp256k1_fe_impl_add((secp256k1_fe *)&stack0xffffffffffffff30,&local_30);
    secp256k1_fe_impl_mul
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,(secp256k1_fe *)0x11804c);
    secp256k1_fe_impl_sqr(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    secp256k1_fe_impl_sqr(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    secp256k1_fe_impl_negate_unchecked
              ((secp256k1_fe *)&stack0xffffffffffffff30,(secp256k1_fe *)&stack0xffffffffffffff30,1);
    secp256k1_fe_impl_add
              ((secp256k1_fe *)&stack0xffffffffffffff58,(secp256k1_fe *)&stack0xffffffffffffff30);
    iVar1 = fe_equal(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    if (iVar1 == 0) break;
    local_4 = local_4 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/tests.c",
          0xc74,"test condition failed: fe_equal(&lhs, &rhs)");
  abort();
}

Assistant:

static void run_sqr(void) {
    int i;
    secp256k1_fe x, y, lhs, rhs, tmp;

    secp256k1_fe_set_int(&x, 1);
    secp256k1_fe_negate(&x, &x, 1);

    for (i = 1; i <= 512; ++i) {
        secp256k1_fe_mul_int(&x, 2);
        secp256k1_fe_normalize(&x);

        /* Check that (x+y)*(x-y) = x^2 - y*2 for some random values y */
        testutil_random_fe_test(&y);

        lhs = x;
        secp256k1_fe_add(&lhs, &y);         /* lhs = x+y */
        secp256k1_fe_negate(&tmp, &y, 1);   /* tmp = -y */
        secp256k1_fe_add(&tmp, &x);         /* tmp = x-y */
        secp256k1_fe_mul(&lhs, &lhs, &tmp); /* lhs = (x+y)*(x-y) */

        secp256k1_fe_sqr(&rhs, &x);         /* rhs = x^2 */
        secp256k1_fe_sqr(&tmp, &y);         /* tmp = y^2 */
        secp256k1_fe_negate(&tmp, &tmp, 1); /* tmp = -y^2 */
        secp256k1_fe_add(&rhs, &tmp);       /* rhs = x^2 - y^2 */

        CHECK(fe_equal(&lhs, &rhs));
    }
}